

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS
ref_smooth_local_cell_about
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT about_node,REF_BOOL *allowed)

{
  REF_ADJ_ITEM pRVar1;
  int iVar2;
  ulong uVar3;
  REF_INT RVar4;
  ulong uVar5;
  
  *allowed = 0;
  uVar3 = 0xffffffff;
  if (-1 < about_node) {
    uVar3 = 0xffffffff;
    if (about_node < ref_cell->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_cell->ref_adj->first[(uint)about_node];
    }
  }
  iVar2 = (int)uVar3;
  if (iVar2 != -1) {
    RVar4 = ref_cell->ref_adj->item[iVar2].ref;
    do {
      if (0 < ref_cell->node_per) {
        uVar5 = 0;
        do {
          if (ref_node->ref_mpi->id !=
              ref_node->part[ref_cell->c2n[(long)RVar4 * (long)ref_cell->size_per + uVar5]]) {
            return (int)uVar3;
          }
          uVar5 = uVar5 + 1;
        } while ((uint)ref_cell->node_per != uVar5);
      }
      pRVar1 = ref_cell->ref_adj->item;
      iVar2 = pRVar1[(int)uVar3].next;
      uVar3 = (ulong)iVar2;
      if (uVar3 == 0xffffffffffffffff) {
        RVar4 = -1;
      }
      else {
        RVar4 = pRVar1[uVar3].ref;
      }
    } while (iVar2 != -1);
  }
  *allowed = 1;
  return iVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_local_cell_about(REF_CELL ref_cell,
                                                      REF_NODE ref_node,
                                                      REF_INT about_node,
                                                      REF_BOOL *allowed) {
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  each_ref_cell_having_node(ref_cell, about_node, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  *allowed = REF_TRUE;

  return REF_SUCCESS;
}